

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractitemview.cpp
# Opt level: O1

bool __thiscall QAbstractItemView::viewportEvent(QAbstractItemView *this,QEvent *event)

{
  ushort uVar1;
  QAbstractItemViewPrivate *this_00;
  void **ppvVar2;
  undefined1 uVar3;
  undefined4 uVar4;
  long *plVar5;
  QScroller *pQVar6;
  undefined4 *puVar7;
  long in_FS_OFFSET;
  double extraout_XMM0_Qa;
  undefined1 auVar8 [16];
  double extraout_XMM1_Qa;
  undefined1 auVar9 [16];
  QObject *in_stack_fffffffffffffec0;
  QSlotObjectBase local_128;
  undefined1 *local_118;
  QStatusTipEvent tip;
  int iStack_104;
  QFont local_b0 [24];
  QLocale local_98 [6];
  QIcon local_68;
  QArrayData *local_60;
  QBrush local_40 [8];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QAbstractItemViewPrivate **)(this + 8);
  uVar1 = *(ushort *)(event + 8);
  if (uVar1 < 0x6e) {
    if (uVar1 < 0x18) {
      if (uVar1 == 10) {
        this_00->viewportEnteredNeeded = true;
      }
      else if (uVar1 == 0xb) {
        _tip = -1;
        iStack_104 = -1;
        QPersistentModelIndex::QPersistentModelIndex
                  ((QPersistentModelIndex *)&local_128,(QModelIndex *)&tip);
        QAbstractItemViewPrivate::setHoverIndex(this_00,(QPersistentModelIndex *)&local_128);
        QPersistentModelIndex::~QPersistentModelIndex((QPersistentModelIndex *)&local_128);
        if ((this_00->shouldClearStatusTip == true) &&
           (*(long *)&(this_00->super_QAbstractScrollAreaPrivate).super_QFramePrivate.
                      super_QWidgetPrivate.field_0x10 != 0)) {
          local_128._0_8_ = (QArrayData *)0x0;
          local_128.m_impl = (ImplFn)0x0;
          local_118 = (undefined1 *)0x0;
          _tip = (code *)&DAT_aaaaaaaaaaaaaaaa;
          QStatusTipEvent::QStatusTipEvent(&tip,(QString *)&local_128);
          QCoreApplication::sendEvent
                    (*(QObject **)
                      &(this_00->super_QAbstractScrollAreaPrivate).super_QFramePrivate.
                       super_QWidgetPrivate.field_0x10,(QEvent *)&tip);
          this_00->shouldClearStatusTip = false;
          QStatusTipEvent::~QStatusTipEvent(&tip);
          if ((QArrayData *)local_128._0_8_ != (QArrayData *)0x0) {
            LOCK();
            (((QBasicAtomicInt *)local_128._0_8_)->_q_value).super___atomic_base<int>._M_i =
                 (((QBasicAtomicInt *)local_128._0_8_)->_q_value).super___atomic_base<int>._M_i + -1
            ;
            UNLOCK();
            if ((((QBasicAtomicInt *)local_128._0_8_)->_q_value).super___atomic_base<int>._M_i == 0)
            {
              QArrayData::deallocate((QArrayData *)local_128._0_8_,2,0x10);
            }
          }
        }
        _tip = (code *)0xffffffffffffffff;
        QPersistentModelIndex::operator=(&this_00->enteredIndex,(QModelIndex *)&tip);
      }
      else if (((uVar1 == 0xc) && (this_00->delayedPendingLayout == true)) &&
              (this_00->state != CollapsingState)) {
        QBasicTimer::stop();
        this_00->delayedPendingLayout = false;
        (**(code **)(**(long **)&(this_00->super_QAbstractScrollAreaPrivate).super_QFramePrivate.
                                 super_QWidgetPrivate.field_0x8 + 0x220))();
      }
    }
    else if (uVar1 - 0x18 < 2) {
      QWidget::update((this_00->super_QAbstractScrollAreaPrivate).viewport);
    }
    else if ((uVar1 == 0x61) && (this_00->delayedPendingLayout == false)) {
      this_00->delayedPendingLayout = true;
      QBasicTimer::start(&this_00->delayedLayout,0,1,
                         *(undefined8 *)
                          &(this_00->super_QAbstractScrollAreaPrivate).super_QFramePrivate.
                           super_QWidgetPrivate.field_0x8);
    }
    goto switchD_0053c841_caseD_7c;
  }
  switch(uVar1) {
  case 0x7c:
  case 0x7d:
  case 0x7e:
    goto switchD_0053c841_caseD_7c;
  case 0x7f:
  case 0x81:
    uVar4 = QEventPoint::position();
    auVar9._0_8_ = (double)((ulong)extraout_XMM1_Qa & 0x8000000000000000 | 0x3fe0000000000000) +
                   extraout_XMM1_Qa;
    auVar9._8_8_ = (double)((ulong)extraout_XMM0_Qa & 0x8000000000000000 | 0x3fe0000000000000) +
                   extraout_XMM0_Qa;
    auVar9 = minpd(_DAT_0066f5d0,auVar9);
    auVar8._8_8_ = -(ulong)(-2147483648.0 < auVar9._8_8_);
    auVar8._0_8_ = -(ulong)(-2147483648.0 < auVar9._0_8_);
    movmskpd(uVar4,auVar8);
    (**(code **)(*(long *)this + 0x1f0))((QModelIndex *)&tip,this);
    QPersistentModelIndex::QPersistentModelIndex
              ((QPersistentModelIndex *)&local_128,(QModelIndex *)&tip);
    QAbstractItemViewPrivate::setHoverIndex(this_00,(QPersistentModelIndex *)&local_128);
    goto LAB_0053cc2a;
  case 0x80:
    _tip = (code *)0xffffffffffffffff;
    QPersistentModelIndex::QPersistentModelIndex
              ((QPersistentModelIndex *)&local_128,(QModelIndex *)&tip);
    QAbstractItemViewPrivate::setHoverIndex(this_00,(QPersistentModelIndex *)&local_128);
LAB_0053cc2a:
    QPersistentModelIndex::~QPersistentModelIndex((QPersistentModelIndex *)&local_128);
switchD_0053c841_caseD_7c:
    uVar3 = QAbstractScrollArea::viewportEvent((QAbstractScrollArea *)this,event);
    break;
  default:
    if (1 < uVar1 - 0x6e) {
      if (uVar1 == 0xcc) {
        executeDelayedItemsLayout(this);
        pQVar6 = QScroller::scroller(in_stack_fffffffffffffec0);
        _tip = QScroller::stateChanged;
        local_128._0_8_ = QAbstractItemViewPrivate::scrollerStateChanged;
        local_128.m_impl = (ImplFn)0x0;
        ppvVar2 = *(void ***)
                   &(this_00->super_QAbstractScrollAreaPrivate).super_QFramePrivate.
                    super_QWidgetPrivate.field_0x8;
        puVar7 = (undefined4 *)operator_new(0x20);
        *puVar7 = 1;
        *(code **)(puVar7 + 2) =
             QtPrivate::
             QPrivateSlotObject<void_(QAbstractItemViewPrivate::*)(),_QtPrivate::List<>,_void>::impl
        ;
        *(code **)(puVar7 + 4) = QAbstractItemViewPrivate::scrollerStateChanged;
        *(undefined8 *)(puVar7 + 6) = 0;
        QObject::connectImpl
                  ((QObject *)&stack0xfffffffffffffec0,(void **)pQVar6,(QObject *)&tip,ppvVar2,
                   &local_128,(ConnectionType)puVar7,(int *)0x80,(QMetaObject *)0x0);
        (this_00->scollerConnection).d_ptr = in_stack_fffffffffffffec0;
        QMetaObject::Connection::~Connection((Connection *)&stack0xfffffffffffffec0);
      }
      goto switchD_0053c841_caseD_7c;
    }
  case 0x7b:
    local_118 = &DAT_aaaaaaaaaaaaaaaa;
    local_128._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_128.m_impl = (ImplFn)&DAT_aaaaaaaaaaaaaaaa;
    (**(code **)(*(long *)this + 0x1f0))(&local_128,this,event + 0x10);
    memset((QStyleOptionViewItem *)&tip,0xaa,0xd0);
    QStyleOptionViewItem::QStyleOptionViewItem((QStyleOptionViewItem *)&tip);
    (**(code **)(*(long *)this + 0x2f8))(this,(QStyleOptionViewItem *)&tip);
    (**(code **)(*(long *)this + 0x1e0))(this,&local_128);
    currentIndex((QModelIndex *)&stack0xfffffffffffffec0,this);
    plVar5 = (long *)(**(code **)(*(long *)this + 0x208))(this,&local_128);
    if (plVar5 == (long *)0x0) {
      uVar3 = 0;
    }
    else {
      uVar3 = (**(code **)(*plVar5 + 0xa0))(plVar5,event,this,&tip,&local_128);
    }
    QBrush::~QBrush(local_40);
    if (local_60 != (QArrayData *)0x0) {
      LOCK();
      (local_60->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_60->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_60->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_60,2,0x10);
      }
    }
    QIcon::~QIcon(&local_68);
    QLocale::~QLocale(local_98);
    QFont::~QFont(local_b0);
    QStyleOption::~QStyleOption((QStyleOption *)&tip);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return (bool)uVar3;
}

Assistant:

bool QAbstractItemView::viewportEvent(QEvent *event)
{
    Q_D(QAbstractItemView);
    switch (event->type()) {
    case QEvent::Paint:
        // Similar to pre-painting in QAbstractItemView::event to update scrollbar
        // visibility, make sure that all pending layout requests have been executed
        // so that the view's data structures are up-to-date before rendering.
        d->executePostedLayout();
        break;
    case QEvent::HoverMove:
    case QEvent::HoverEnter:
        d->setHoverIndex(indexAt(static_cast<QHoverEvent*>(event)->position().toPoint()));
        break;
    case QEvent::HoverLeave:
        d->setHoverIndex(QModelIndex());
        break;
    case QEvent::Enter:
        d->viewportEnteredNeeded = true;
        break;
    case QEvent::Leave:
        d->setHoverIndex(QModelIndex()); // If we've left, no hover should be needed anymore
    #if QT_CONFIG(statustip)
        if (d->shouldClearStatusTip && d->parent) {
            QString empty;
            QStatusTipEvent tip(empty);
            QCoreApplication::sendEvent(d->parent, &tip);
            d->shouldClearStatusTip = false;
        }
    #endif
        d->enteredIndex = QModelIndex();
        break;
    case QEvent::ToolTip:
    case QEvent::QueryWhatsThis:
    case QEvent::WhatsThis: {
        QHelpEvent *he = static_cast<QHelpEvent*>(event);
        const QModelIndex index = indexAt(he->pos());
        QStyleOptionViewItem option;
        initViewItemOption(&option);
        option.rect = visualRect(index);
        option.state |= (index == currentIndex() ? QStyle::State_HasFocus : QStyle::State_None);

        QAbstractItemDelegate *delegate = itemDelegateForIndex(index);
        if (!delegate)
            return false;
        return delegate->helpEvent(he, this, option, index);
    }
    case QEvent::FontChange:
        d->doDelayedItemsLayout(); // the size of the items will change
        break;
    case QEvent::WindowActivate:
    case QEvent::WindowDeactivate:
        d->viewport->update();
        break;
    case QEvent::ScrollPrepare:
        executeDelayedItemsLayout();
#if QT_CONFIG(gestures) && QT_CONFIG(scroller)
        d->scollerConnection = QObjectPrivate::connect(
              QScroller::scroller(d->viewport), &QScroller::stateChanged,
              d, &QAbstractItemViewPrivate::scrollerStateChanged,
              Qt::UniqueConnection);
#endif
        break;

    default:
        break;
    }
    return QAbstractScrollArea::viewportEvent(event);
}